

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void fadst16x16_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  uint uVar1;
  uint uVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  __m256i alVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  long lVar16;
  uint uVar17;
  int iVar18;
  undefined7 in_register_00000011;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  longlong local_158;
  longlong lStack_150;
  longlong lStack_148;
  longlong lStack_140;
  longlong local_118;
  longlong lStack_110;
  longlong lStack_108;
  longlong lStack_100;
  longlong local_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  longlong lStack_c0;
  longlong local_b8;
  longlong lStack_b0;
  longlong lStack_a8;
  longlong lStack_a0;
  longlong local_58;
  longlong lStack_50;
  longlong lStack_48;
  longlong lStack_40;
  
  uVar17 = (uint)CONCAT71(in_register_00000011,cos_bit);
  lVar16 = (long)(int)uVar17 * 0x100;
  iVar18 = 1 << (cos_bit - 1U & 0x1f);
  auVar23._4_4_ = iVar18;
  auVar23._0_4_ = iVar18;
  auVar23._8_4_ = iVar18;
  auVar23._12_4_ = iVar18;
  auVar23._16_4_ = iVar18;
  auVar23._20_4_ = iVar18;
  auVar23._24_4_ = iVar18;
  auVar23._28_4_ = iVar18;
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x1e0);
  iVar18 = (uVar20 & 0xffff) + uVar20 * 0x10000;
  auVar24._4_4_ = iVar18;
  auVar24._0_4_ = iVar18;
  auVar24._8_4_ = iVar18;
  auVar24._12_4_ = iVar18;
  auVar24._16_4_ = iVar18;
  auVar24._20_4_ = iVar18;
  auVar24._24_4_ = iVar18;
  auVar24._28_4_ = iVar18;
  iVar18 = (uVar20 & 0xffff) + uVar20 * -0x10000;
  auVar37 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar36 = vpsubsw_avx2(auVar37,(undefined1  [32])input[0xf]);
  auVar14 = vpsubsw_avx2(auVar37,(undefined1  [32])input[7]);
  auVar27._4_4_ = iVar18;
  auVar27._0_4_ = iVar18;
  auVar27._8_4_ = iVar18;
  auVar27._12_4_ = iVar18;
  auVar27._16_4_ = iVar18;
  auVar27._20_4_ = iVar18;
  auVar27._24_4_ = iVar18;
  auVar27._28_4_ = iVar18;
  auVar41 = vpsubsw_avx2(auVar37,(undefined1  [32])input[3]);
  auVar47 = vpsubsw_avx2(auVar37,(undefined1  [32])input[0xb]);
  auVar33 = vpsubsw_avx2(auVar37,(undefined1  [32])input[9]);
  auVar34 = vpsubsw_avx2(auVar37,(undefined1  [32])input[5]);
  auVar15 = vpunpcklwd_avx2(auVar14,(undefined1  [32])input[8]);
  auVar31 = vpunpckhwd_avx2(auVar14,(undefined1  [32])input[8]);
  auVar14 = vpmaddwd_avx2(auVar15,auVar24);
  auVar30 = vpmaddwd_avx2(auVar31,auVar24);
  auVar15 = vpmaddwd_avx2(auVar15,auVar27);
  auVar31 = vpmaddwd_avx2(auVar31,auVar27);
  auVar14 = vpaddd_avx2(auVar14,auVar23);
  auVar30 = vpaddd_avx2(auVar30,auVar23);
  auVar15 = vpaddd_avx2(auVar15,auVar23);
  auVar31 = vpaddd_avx2(auVar31,auVar23);
  auVar14 = vpsrad_avx2(auVar14,ZEXT416(uVar17));
  auVar30 = vpsrad_avx2(auVar30,ZEXT416(uVar17));
  auVar22 = ZEXT416(uVar17);
  auVar15 = vpsrad_avx2(auVar15,auVar22);
  auVar14 = vpackssdw_avx2(auVar14,auVar30);
  auVar30 = vpsrad_avx2(auVar31,auVar22);
  auVar30 = vpackssdw_avx2(auVar15,auVar30);
  auVar35 = vpunpcklwd_avx2((undefined1  [32])input[4],auVar47);
  auVar32 = vpunpckhwd_avx2((undefined1  [32])input[4],auVar47);
  auVar15 = vpmaddwd_avx2(auVar35,auVar24);
  auVar31 = vpmaddwd_avx2(auVar32,auVar24);
  auVar47 = vpmaddwd_avx2(auVar35,auVar27);
  auVar32 = vpmaddwd_avx2(auVar32,auVar27);
  auVar15 = vpaddd_avx2(auVar15,auVar23);
  auVar31 = vpaddd_avx2(auVar31,auVar23);
  auVar47 = vpaddd_avx2(auVar47,auVar23);
  auVar32 = vpaddd_avx2(auVar32,auVar23);
  auVar15 = vpsrad_avx2(auVar15,auVar22);
  auVar31 = vpsrad_avx2(auVar31,auVar22);
  auVar22 = ZEXT416(uVar17);
  auVar47 = vpsrad_avx2(auVar47,auVar22);
  auVar15 = vpackssdw_avx2(auVar15,auVar31);
  auVar31 = vpsrad_avx2(auVar32,auVar22);
  auVar31 = vpackssdw_avx2(auVar47,auVar31);
  auVar35 = vpunpcklwd_avx2((undefined1  [32])input[6],auVar33);
  auVar33 = vpunpckhwd_avx2((undefined1  [32])input[6],auVar33);
  auVar47 = vpmaddwd_avx2(auVar35,auVar24);
  auVar32 = vpmaddwd_avx2(auVar33,auVar24);
  auVar47 = vpaddd_avx2(auVar47,auVar23);
  auVar32 = vpaddd_avx2(auVar32,auVar23);
  auVar47 = vpsrad_avx2(auVar47,auVar22);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar47 = vpackssdw_avx2(auVar47,auVar32);
  auVar32 = vpmaddwd_avx2(auVar35,auVar27);
  auVar33 = vpmaddwd_avx2(auVar33,auVar27);
  auVar32 = vpaddd_avx2(auVar32,auVar23);
  auVar33 = vpaddd_avx2(auVar33,auVar23);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar33 = vpsrad_avx2(auVar33,auVar22);
  auVar32 = vpackssdw_avx2(auVar32,auVar33);
  auVar35 = vpunpcklwd_avx2(auVar34,(undefined1  [32])input[10]);
  auVar40 = vpunpckhwd_avx2(auVar34,(undefined1  [32])input[10]);
  auVar33 = vpmaddwd_avx2(auVar35,auVar24);
  auVar34 = vpmaddwd_avx2(auVar40,auVar24);
  auVar35 = vpmaddwd_avx2(auVar35,auVar27);
  auVar40 = vpmaddwd_avx2(auVar40,auVar27);
  auVar33 = vpaddd_avx2(auVar33,auVar23);
  auVar34 = vpaddd_avx2(auVar34,auVar23);
  auVar33 = vpsrad_avx2(auVar33,auVar22);
  auVar34 = vpsrad_avx2(auVar34,auVar22);
  auVar33 = vpackssdw_avx2(auVar33,auVar34);
  auVar34 = vpaddd_avx2(auVar35,auVar23);
  auVar35 = vpaddd_avx2(auVar40,auVar23);
  auVar22 = ZEXT416(uVar17);
  auVar34 = vpsrad_avx2(auVar34,auVar22);
  auVar35 = vpsrad_avx2(auVar35,auVar22);
  auVar34 = vpackssdw_avx2(auVar34,auVar35);
  auVar40 = vpaddsw_avx2(auVar14,(undefined1  [32])*input);
  auVar42 = vpsubsw_avx2((undefined1  [32])*input,auVar14);
  auVar24 = vpaddsw_avx2(auVar30,auVar36);
  auVar46 = vpsubsw_avx2(auVar36,auVar30);
  auVar14 = vpaddsw_avx2(auVar15,auVar41);
  auVar35 = vpsubsw_avx2(auVar41,auVar15);
  auVar15 = vpsubsw_avx2(auVar37,(undefined1  [32])input[1]);
  auVar30 = vpaddsw_avx2((undefined1  [32])input[0xc],auVar31);
  auVar27 = vpsubsw_avx2((undefined1  [32])input[0xc],auVar31);
  auVar36 = vpaddsw_avx2(auVar47,auVar15);
  auVar43 = vpsubsw_avx2(auVar15,auVar47);
  auVar41 = vpaddsw_avx2(auVar32,(undefined1  [32])input[0xe]);
  auVar26 = vpsubsw_avx2((undefined1  [32])input[0xe],auVar32);
  auVar32 = vpaddsw_avx2((undefined1  [32])input[2],auVar33);
  auVar45 = vpsubsw_avx2((undefined1  [32])input[2],auVar33);
  auVar15 = vpsubsw_avx2(auVar37,(undefined1  [32])input[0xd]);
  auVar33 = vpaddsw_avx2(auVar15,auVar34);
  auVar37 = vpsubsw_avx2(auVar15,auVar34);
  auVar31 = vpunpcklwd_avx2(auVar14,auVar30);
  auVar15 = vpunpckhwd_avx2(auVar14,auVar30);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x1a0);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x220);
  uVar21 = uVar1 << 0x10 | uVar20 & 0xffff;
  auVar38._4_4_ = uVar21;
  auVar38._0_4_ = uVar21;
  auVar38._8_4_ = uVar21;
  auVar38._12_4_ = uVar21;
  auVar38._16_4_ = uVar21;
  auVar38._20_4_ = uVar21;
  auVar38._24_4_ = uVar21;
  auVar38._28_4_ = uVar21;
  auVar14 = vpmaddwd_avx2(auVar31,auVar38);
  auVar14 = vpaddd_avx2(auVar14,auVar23);
  auVar30 = vpmaddwd_avx2(auVar15,auVar38);
  auVar30 = vpaddd_avx2(auVar30,auVar23);
  auVar14 = vpsrad_avx2(auVar14,auVar22);
  auVar30 = vpsrad_avx2(auVar30,auVar22);
  auVar14 = vpackssdw_avx2(auVar14,auVar30);
  iVar18 = (uVar1 & 0xffff) + uVar20 * -0x10000;
  auVar28._4_4_ = iVar18;
  auVar28._0_4_ = iVar18;
  auVar28._8_4_ = iVar18;
  auVar28._12_4_ = iVar18;
  auVar28._16_4_ = iVar18;
  auVar28._20_4_ = iVar18;
  auVar28._24_4_ = iVar18;
  auVar28._28_4_ = iVar18;
  auVar30 = vpmaddwd_avx2(auVar31,auVar28);
  auVar15 = vpmaddwd_avx2(auVar15,auVar28);
  auVar30 = vpaddd_avx2(auVar30,auVar23);
  auVar31 = vpsrad_avx2(auVar30,auVar22);
  auVar30 = vpaddd_avx2(auVar15,auVar23);
  auVar30 = vpsrad_avx2(auVar30,auVar22);
  auVar30 = vpackssdw_avx2(auVar31,auVar30);
  auVar34 = vpunpcklwd_avx2(auVar35,auVar27);
  auVar47 = vpunpckhwd_avx2(auVar35,auVar27);
  uVar20 = -uVar1 & 0xffff | uVar20 * 0x10000;
  auVar25._4_4_ = uVar20;
  auVar25._0_4_ = uVar20;
  auVar25._8_4_ = uVar20;
  auVar25._12_4_ = uVar20;
  auVar25._16_4_ = uVar20;
  auVar25._20_4_ = uVar20;
  auVar25._24_4_ = uVar20;
  auVar25._28_4_ = uVar20;
  auVar15 = vpmaddwd_avx2(auVar34,auVar25);
  auVar15 = vpaddd_avx2(auVar15,auVar23);
  auVar31 = vpsrad_avx2(auVar15,auVar22);
  auVar15 = vpmaddwd_avx2(auVar47,auVar25);
  auVar15 = vpaddd_avx2(auVar15,auVar23);
  auVar15 = vpsrad_avx2(auVar15,auVar22);
  auVar15 = vpackssdw_avx2(auVar31,auVar15);
  auVar31 = vpmaddwd_avx2(auVar34,auVar38);
  auVar47 = vpmaddwd_avx2(auVar47,auVar38);
  auVar31 = vpaddd_avx2(auVar31,auVar23);
  auVar47 = vpaddd_avx2(auVar47,auVar23);
  auVar31 = vpsrad_avx2(auVar31,auVar22);
  auVar47 = vpsrad_avx2(auVar47,auVar22);
  auVar31 = vpackssdw_avx2(auVar31,auVar47);
  auVar35 = vpunpcklwd_avx2(auVar32,auVar33);
  auVar34 = vpunpckhwd_avx2(auVar32,auVar33);
  auVar47 = vpmaddwd_avx2(auVar35,auVar38);
  auVar33 = vpmaddwd_avx2(auVar35,auVar28);
  auVar47 = vpaddd_avx2(auVar47,auVar23);
  auVar32 = vpmaddwd_avx2(auVar34,auVar38);
  auVar32 = vpaddd_avx2(auVar32,auVar23);
  auVar47 = vpsrad_avx2(auVar47,auVar22);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar34 = vpmaddwd_avx2(auVar34,auVar28);
  auVar47 = vpackssdw_avx2(auVar47,auVar32);
  auVar32 = vpaddd_avx2(auVar33,auVar23);
  auVar33 = vpaddd_avx2(auVar34,auVar23);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar33 = vpsrad_avx2(auVar33,auVar22);
  auVar32 = vpackssdw_avx2(auVar32,auVar33);
  auVar35 = vpunpcklwd_avx2(auVar45,auVar37);
  auVar27 = vpunpckhwd_avx2(auVar45,auVar37);
  auVar33 = vpmaddwd_avx2(auVar35,auVar25);
  auVar34 = vpmaddwd_avx2(auVar27,auVar25);
  auVar35 = vpmaddwd_avx2(auVar35,auVar38);
  auVar33 = vpaddd_avx2(auVar33,auVar23);
  auVar34 = vpaddd_avx2(auVar34,auVar23);
  auVar33 = vpsrad_avx2(auVar33,auVar22);
  auVar34 = vpsrad_avx2(auVar34,auVar22);
  auVar27 = vpmaddwd_avx2(auVar27,auVar38);
  auVar33 = vpackssdw_avx2(auVar33,auVar34);
  auVar34 = vpaddd_avx2(auVar35,auVar23);
  auVar35 = vpaddd_avx2(auVar27,auVar23);
  auVar22 = ZEXT416(uVar17);
  auVar34 = vpsrad_avx2(auVar34,auVar22);
  auVar35 = vpsrad_avx2(auVar35,auVar22);
  auVar34 = vpackssdw_avx2(auVar34,auVar35);
  auVar27 = vpaddsw_avx2(auVar14,auVar40);
  auVar45 = vpsubsw_avx2(auVar40,auVar14);
  auVar40 = vpaddsw_avx2(auVar30,auVar24);
  auVar37 = vpsubsw_avx2(auVar24,auVar30);
  auVar24 = vpaddsw_avx2(auVar42,auVar15);
  auVar25 = vpsubsw_avx2(auVar42,auVar15);
  auVar42 = vpaddsw_avx2(auVar46,auVar31);
  auVar46 = vpsubsw_avx2(auVar46,auVar31);
  auVar14 = vpaddsw_avx2(auVar36,auVar47);
  auVar35 = vpsubsw_avx2(auVar36,auVar47);
  auVar30 = vpaddsw_avx2(auVar41,auVar32);
  auVar36 = vpsubsw_avx2(auVar41,auVar32);
  auVar15 = vpaddsw_avx2(auVar33,auVar43);
  auVar41 = vpsubsw_avx2(auVar43,auVar33);
  auVar31 = vpaddsw_avx2(auVar26,auVar34);
  auVar43 = vpsubsw_avx2(auVar26,auVar34);
  auVar47 = vpunpcklwd_avx2(auVar14,auVar30);
  auVar30 = vpunpckhwd_avx2(auVar14,auVar30);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x180);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x240);
  uVar21 = uVar1 << 0x10 | uVar20 & 0xffff;
  auVar29._4_4_ = uVar21;
  auVar29._0_4_ = uVar21;
  auVar29._8_4_ = uVar21;
  auVar29._12_4_ = uVar21;
  auVar29._16_4_ = uVar21;
  auVar29._20_4_ = uVar21;
  auVar29._24_4_ = uVar21;
  auVar29._28_4_ = uVar21;
  iVar18 = (uVar1 & 0xffff) + uVar20 * -0x10000;
  auVar49._4_4_ = iVar18;
  auVar49._0_4_ = iVar18;
  auVar49._8_4_ = iVar18;
  auVar49._12_4_ = iVar18;
  auVar49._16_4_ = iVar18;
  auVar49._20_4_ = iVar18;
  auVar49._24_4_ = iVar18;
  auVar49._28_4_ = iVar18;
  auVar14 = vpmaddwd_avx2(auVar47,auVar29);
  auVar47 = vpmaddwd_avx2(auVar49,auVar47);
  auVar32 = vpmaddwd_avx2(auVar49,auVar30);
  auVar30 = vpmaddwd_avx2(auVar30,auVar29);
  auVar14 = vpaddd_avx2(auVar14,auVar23);
  auVar30 = vpaddd_avx2(auVar30,auVar23);
  auVar14 = vpsrad_avx2(auVar14,auVar22);
  auVar30 = vpsrad_avx2(auVar30,auVar22);
  auVar14 = vpackssdw_avx2(auVar14,auVar30);
  auVar30 = vpaddd_avx2(auVar47,auVar23);
  auVar47 = vpsrad_avx2(auVar30,auVar22);
  auVar30 = vpaddd_avx2(auVar32,auVar23);
  auVar30 = vpsrad_avx2(auVar30,auVar22);
  auVar30 = vpackssdw_avx2(auVar47,auVar30);
  auVar47 = vpunpcklwd_avx2(auVar15,auVar31);
  auVar32 = vpunpckhwd_avx2(auVar15,auVar31);
  uVar21 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x200);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x1c0);
  uVar19 = uVar2 << 0x10 | uVar21 & 0xffff;
  auVar26._4_4_ = uVar19;
  auVar26._0_4_ = uVar19;
  auVar26._8_4_ = uVar19;
  auVar26._12_4_ = uVar19;
  auVar26._16_4_ = uVar19;
  auVar26._20_4_ = uVar19;
  auVar26._24_4_ = uVar19;
  auVar26._28_4_ = uVar19;
  iVar18 = (uVar2 & 0xffff) + uVar21 * -0x10000;
  auVar39._4_4_ = iVar18;
  auVar39._0_4_ = iVar18;
  auVar39._8_4_ = iVar18;
  auVar39._12_4_ = iVar18;
  auVar39._16_4_ = iVar18;
  auVar39._20_4_ = iVar18;
  auVar39._24_4_ = iVar18;
  auVar39._28_4_ = iVar18;
  auVar15 = vpmaddwd_avx2(auVar47,auVar26);
  auVar31 = vpmaddwd_avx2(auVar47,auVar39);
  auVar47 = vpmaddwd_avx2(auVar32,auVar39);
  auVar32 = vpmaddwd_avx2(auVar32,auVar26);
  auVar15 = vpaddd_avx2(auVar15,auVar23);
  auVar33 = vpsrad_avx2(auVar15,auVar22);
  auVar15 = vpaddd_avx2(auVar32,auVar23);
  auVar15 = vpsrad_avx2(auVar15,auVar22);
  auVar15 = vpackssdw_avx2(auVar33,auVar15);
  auVar31 = vpaddd_avx2(auVar31,auVar23);
  auVar47 = vpaddd_avx2(auVar47,auVar23);
  auVar31 = vpsrad_avx2(auVar31,auVar22);
  auVar47 = vpsrad_avx2(auVar47,auVar22);
  auVar31 = vpackssdw_avx2(auVar31,auVar47);
  auVar33 = vpunpcklwd_avx2(auVar35,auVar36);
  auVar34 = vpunpckhwd_avx2(auVar35,auVar36);
  uVar20 = -uVar1 & 0xffff | uVar20 * 0x10000;
  auVar50._4_4_ = uVar20;
  auVar50._0_4_ = uVar20;
  auVar50._8_4_ = uVar20;
  auVar50._12_4_ = uVar20;
  auVar50._16_4_ = uVar20;
  auVar50._20_4_ = uVar20;
  auVar50._24_4_ = uVar20;
  auVar50._28_4_ = uVar20;
  auVar47 = vpmaddwd_avx2(auVar50,auVar33);
  auVar32 = vpmaddwd_avx2(auVar50,auVar34);
  auVar33 = vpmaddwd_avx2(auVar33,auVar29);
  auVar34 = vpmaddwd_avx2(auVar34,auVar29);
  auVar47 = vpaddd_avx2(auVar47,auVar23);
  auVar32 = vpaddd_avx2(auVar32,auVar23);
  auVar47 = vpsrad_avx2(auVar47,auVar22);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar47 = vpackssdw_avx2(auVar47,auVar32);
  auVar32 = vpaddd_avx2(auVar33,auVar23);
  auVar33 = vpsrad_avx2(auVar32,auVar22);
  auVar32 = vpaddd_avx2(auVar34,auVar23);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar32 = vpackssdw_avx2(auVar33,auVar32);
  auVar35 = vpunpcklwd_avx2(auVar41,auVar43);
  auVar36 = vpunpckhwd_avx2(auVar41,auVar43);
  uVar20 = -uVar2 & 0xffff | uVar21 * 0x10000;
  auVar48._4_4_ = uVar20;
  auVar48._0_4_ = uVar20;
  auVar48._8_4_ = uVar20;
  auVar48._12_4_ = uVar20;
  auVar48._16_4_ = uVar20;
  auVar48._20_4_ = uVar20;
  auVar48._24_4_ = uVar20;
  auVar48._28_4_ = uVar20;
  auVar33 = vpmaddwd_avx2(auVar48,auVar35);
  auVar34 = vpmaddwd_avx2(auVar36,auVar48);
  auVar35 = vpmaddwd_avx2(auVar35,auVar26);
  auVar33 = vpaddd_avx2(auVar33,auVar23);
  auVar34 = vpaddd_avx2(auVar34,auVar23);
  auVar33 = vpsrad_avx2(auVar33,auVar22);
  auVar34 = vpsrad_avx2(auVar34,auVar22);
  auVar36 = vpmaddwd_avx2(auVar36,auVar26);
  auVar33 = vpackssdw_avx2(auVar33,auVar34);
  auVar34 = vpaddd_avx2(auVar35,auVar23);
  auVar35 = vpaddd_avx2(auVar36,auVar23);
  auVar34 = vpsrad_avx2(auVar34,auVar22);
  auVar35 = vpsrad_avx2(auVar35,auVar22);
  auVar34 = vpackssdw_avx2(auVar34,auVar35);
  auVar35 = vpaddsw_avx2(auVar14,auVar27);
  auVar43 = vpsubsw_avx2(auVar27,auVar14);
  auVar14 = vpaddsw_avx2(auVar40,auVar30);
  auVar26 = vpsubsw_avx2(auVar40,auVar30);
  auVar40 = vpaddsw_avx2(auVar24,auVar15);
  auVar28 = vpsubsw_avx2(auVar24,auVar15);
  auVar24 = vpaddsw_avx2(auVar42,auVar31);
  auVar29 = vpsubsw_avx2(auVar42,auVar31);
  auVar36 = vpaddsw_avx2(auVar45,auVar47);
  auVar45 = vpsubsw_avx2(auVar45,auVar47);
  auVar41 = vpaddsw_avx2(auVar37,auVar32);
  auVar37 = vpsubsw_avx2(auVar37,auVar32);
  auVar27 = vpaddsw_avx2(auVar25,auVar33);
  auVar25 = vpsubsw_avx2(auVar25,auVar33);
  auVar42 = vpaddsw_avx2(auVar46,auVar34);
  auVar46 = vpsubsw_avx2(auVar46,auVar34);
  auVar15 = vpunpcklwd_avx2(auVar35,auVar14);
  auVar31 = vpunpckhwd_avx2(auVar35,auVar14);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 600);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x168);
  uVar21 = uVar20 << 0x10 | uVar1 & 0xffff;
  auVar30._4_4_ = uVar21;
  auVar30._0_4_ = uVar21;
  auVar30._8_4_ = uVar21;
  auVar30._12_4_ = uVar21;
  auVar30._16_4_ = uVar21;
  auVar30._20_4_ = uVar21;
  auVar30._24_4_ = uVar21;
  auVar30._28_4_ = uVar21;
  iVar18 = (uVar20 & 0xffff) + uVar1 * -0x10000;
  auVar47._4_4_ = iVar18;
  auVar47._0_4_ = iVar18;
  auVar47._8_4_ = iVar18;
  auVar47._12_4_ = iVar18;
  auVar47._16_4_ = iVar18;
  auVar47._20_4_ = iVar18;
  auVar47._24_4_ = iVar18;
  auVar47._28_4_ = iVar18;
  auVar14 = vpmaddwd_avx2(auVar15,auVar30);
  auVar30 = vpmaddwd_avx2(auVar31,auVar30);
  auVar15 = vpmaddwd_avx2(auVar47,auVar15);
  auVar31 = vpmaddwd_avx2(auVar47,auVar31);
  auVar14 = vpaddd_avx2(auVar14,auVar23);
  auVar47 = vpsrad_avx2(auVar14,auVar22);
  auVar14 = vpaddd_avx2(auVar30,auVar23);
  auVar14 = vpsrad_avx2(auVar14,auVar22);
  auVar14 = vpackssdw_avx2(auVar47,auVar14);
  auVar30 = vpaddd_avx2(auVar15,auVar23);
  auVar15 = vpaddd_avx2(auVar31,auVar23);
  auVar30 = vpsrad_avx2(auVar30,auVar22);
  auVar15 = vpsrad_avx2(auVar15,auVar22);
  auVar30 = vpackssdw_avx2(auVar30,auVar15);
  auVar47 = vpunpcklwd_avx2(auVar40,auVar24);
  auVar32 = vpunpckhwd_avx2(auVar40,auVar24);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x188);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x238);
  uVar21 = uVar1 << 0x10 | uVar20 & 0xffff;
  auVar31._4_4_ = uVar21;
  auVar31._0_4_ = uVar21;
  auVar31._8_4_ = uVar21;
  auVar31._12_4_ = uVar21;
  auVar31._16_4_ = uVar21;
  auVar31._20_4_ = uVar21;
  auVar31._24_4_ = uVar21;
  auVar31._28_4_ = uVar21;
  iVar18 = (uVar1 & 0xffff) + uVar20 * -0x10000;
  auVar34._4_4_ = iVar18;
  auVar34._0_4_ = iVar18;
  auVar34._8_4_ = iVar18;
  auVar34._12_4_ = iVar18;
  auVar34._16_4_ = iVar18;
  auVar34._20_4_ = iVar18;
  auVar34._24_4_ = iVar18;
  auVar34._28_4_ = iVar18;
  auVar15 = vpmaddwd_avx2(auVar47,auVar31);
  auVar31 = vpmaddwd_avx2(auVar32,auVar31);
  auVar47 = vpmaddwd_avx2(auVar47,auVar34);
  auVar15 = vpaddd_avx2(auVar15,auVar23);
  auVar31 = vpaddd_avx2(auVar31,auVar23);
  auVar15 = vpsrad_avx2(auVar15,auVar22);
  auVar31 = vpsrad_avx2(auVar31,auVar22);
  auVar32 = vpmaddwd_avx2(auVar32,auVar34);
  auVar15 = vpackssdw_avx2(auVar15,auVar31);
  auVar31 = vpaddd_avx2(auVar47,auVar23);
  auVar47 = vpaddd_avx2(auVar32,auVar23);
  auVar31 = vpsrad_avx2(auVar31,auVar22);
  auVar47 = vpsrad_avx2(auVar47,auVar22);
  auVar31 = vpackssdw_avx2(auVar31,auVar47);
  auVar33 = vpunpcklwd_avx2(auVar36,auVar41);
  auVar34 = vpunpckhwd_avx2(auVar36,auVar41);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x1a8);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x218);
  uVar21 = uVar1 << 0x10 | uVar20 & 0xffff;
  auVar32._4_4_ = uVar21;
  auVar32._0_4_ = uVar21;
  auVar32._8_4_ = uVar21;
  auVar32._12_4_ = uVar21;
  auVar32._16_4_ = uVar21;
  auVar32._20_4_ = uVar21;
  auVar32._24_4_ = uVar21;
  auVar32._28_4_ = uVar21;
  iVar18 = (uVar1 & 0xffff) + uVar20 * -0x10000;
  auVar35._4_4_ = iVar18;
  auVar35._0_4_ = iVar18;
  auVar35._8_4_ = iVar18;
  auVar35._12_4_ = iVar18;
  auVar35._16_4_ = iVar18;
  auVar35._20_4_ = iVar18;
  auVar35._24_4_ = iVar18;
  auVar35._28_4_ = iVar18;
  auVar47 = vpmaddwd_avx2(auVar33,auVar32);
  auVar32 = vpmaddwd_avx2(auVar34,auVar32);
  auVar33 = vpmaddwd_avx2(auVar33,auVar35);
  auVar34 = vpmaddwd_avx2(auVar34,auVar35);
  auVar47 = vpaddd_avx2(auVar47,auVar23);
  auVar35 = vpsrad_avx2(auVar47,auVar22);
  auVar47 = vpaddd_avx2(auVar32,auVar23);
  auVar47 = vpsrad_avx2(auVar47,auVar22);
  auVar47 = vpackssdw_avx2(auVar35,auVar47);
  auVar32 = vpaddd_avx2(auVar33,auVar23);
  auVar33 = vpaddd_avx2(auVar34,auVar23);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar33 = vpsrad_avx2(auVar33,auVar22);
  alVar3 = (__m256i)vpackssdw_avx2(auVar32,auVar33);
  auVar34 = vpunpcklwd_avx2(auVar27,auVar42);
  auVar40 = vpunpckhwd_avx2(auVar27,auVar42);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x1c8);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x1f8);
  uVar21 = uVar1 << 0x10 | uVar20 & 0xffff;
  auVar33._4_4_ = uVar21;
  auVar33._0_4_ = uVar21;
  auVar33._8_4_ = uVar21;
  auVar33._12_4_ = uVar21;
  auVar33._16_4_ = uVar21;
  auVar33._20_4_ = uVar21;
  auVar33._24_4_ = uVar21;
  auVar33._28_4_ = uVar21;
  iVar18 = (uVar1 & 0xffff) + uVar20 * -0x10000;
  auVar36._4_4_ = iVar18;
  auVar36._0_4_ = iVar18;
  auVar36._8_4_ = iVar18;
  auVar36._12_4_ = iVar18;
  auVar36._16_4_ = iVar18;
  auVar36._20_4_ = iVar18;
  auVar36._24_4_ = iVar18;
  auVar36._28_4_ = iVar18;
  auVar32 = vpmaddwd_avx2(auVar34,auVar33);
  auVar33 = vpmaddwd_avx2(auVar40,auVar33);
  auVar34 = vpmaddwd_avx2(auVar34,auVar36);
  auVar32 = vpaddd_avx2(auVar32,auVar23);
  auVar33 = vpaddd_avx2(auVar33,auVar23);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar35 = vpsrad_avx2(auVar33,auVar22);
  auVar33 = vpmaddwd_avx2(auVar40,auVar36);
  alVar4 = (__m256i)vpackssdw_avx2(auVar32,auVar35);
  auVar32 = vpaddd_avx2(auVar34,auVar23);
  auVar33 = vpaddd_avx2(auVar33,auVar23);
  auVar22 = ZEXT416(uVar17);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar33 = vpsrad_avx2(auVar33,auVar22);
  alVar5 = (__m256i)vpackssdw_avx2(auVar32,auVar33);
  auVar34 = vpunpcklwd_avx2(auVar43,auVar26);
  auVar35 = vpunpckhwd_avx2(auVar43,auVar26);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x1e8);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x1d8);
  uVar21 = uVar1 << 0x10 | uVar20 & 0xffff;
  auVar40._4_4_ = uVar21;
  auVar40._0_4_ = uVar21;
  auVar40._8_4_ = uVar21;
  auVar40._12_4_ = uVar21;
  auVar40._16_4_ = uVar21;
  auVar40._20_4_ = uVar21;
  auVar40._24_4_ = uVar21;
  auVar40._28_4_ = uVar21;
  iVar18 = (uVar1 & 0xffff) + uVar20 * -0x10000;
  auVar43._4_4_ = iVar18;
  auVar43._0_4_ = iVar18;
  auVar43._8_4_ = iVar18;
  auVar43._12_4_ = iVar18;
  auVar43._16_4_ = iVar18;
  auVar43._20_4_ = iVar18;
  auVar43._24_4_ = iVar18;
  auVar43._28_4_ = iVar18;
  auVar32 = vpmaddwd_avx2(auVar34,auVar40);
  auVar33 = vpmaddwd_avx2(auVar35,auVar40);
  auVar34 = vpmaddwd_avx2(auVar34,auVar43);
  auVar35 = vpmaddwd_avx2(auVar35,auVar43);
  auVar32 = vpaddd_avx2(auVar32,auVar23);
  auVar40 = vpsrad_avx2(auVar32,auVar22);
  auVar32 = vpaddd_avx2(auVar33,auVar23);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  alVar6 = (__m256i)vpackssdw_avx2(auVar40,auVar32);
  auVar32 = vpaddd_avx2(auVar34,auVar23);
  auVar33 = vpaddd_avx2(auVar35,auVar23);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar33 = vpsrad_avx2(auVar33,auVar22);
  alVar7 = (__m256i)vpackssdw_avx2(auVar32,auVar33);
  auVar34 = vpunpcklwd_avx2(auVar28,auVar29);
  auVar40 = vpunpckhwd_avx2(auVar28,auVar29);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x208);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x1b8);
  uVar21 = uVar1 << 0x10 | uVar20 & 0xffff;
  auVar41._4_4_ = uVar21;
  auVar41._0_4_ = uVar21;
  auVar41._8_4_ = uVar21;
  auVar41._12_4_ = uVar21;
  auVar41._16_4_ = uVar21;
  auVar41._20_4_ = uVar21;
  auVar41._24_4_ = uVar21;
  auVar41._28_4_ = uVar21;
  iVar18 = (uVar1 & 0xffff) + uVar20 * -0x10000;
  auVar44._4_4_ = iVar18;
  auVar44._0_4_ = iVar18;
  auVar44._8_4_ = iVar18;
  auVar44._12_4_ = iVar18;
  auVar44._16_4_ = iVar18;
  auVar44._20_4_ = iVar18;
  auVar44._24_4_ = iVar18;
  auVar44._28_4_ = iVar18;
  auVar32 = vpmaddwd_avx2(auVar34,auVar41);
  auVar33 = vpmaddwd_avx2(auVar40,auVar41);
  auVar34 = vpmaddwd_avx2(auVar34,auVar44);
  auVar32 = vpaddd_avx2(auVar32,auVar23);
  auVar33 = vpaddd_avx2(auVar33,auVar23);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar35 = vpsrad_avx2(auVar33,auVar22);
  auVar33 = vpmaddwd_avx2(auVar40,auVar44);
  alVar8 = (__m256i)vpackssdw_avx2(auVar32,auVar35);
  auVar32 = vpaddd_avx2(auVar34,auVar23);
  auVar33 = vpaddd_avx2(auVar33,auVar23);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar33 = vpsrad_avx2(auVar33,auVar22);
  alVar9 = (__m256i)vpackssdw_avx2(auVar32,auVar33);
  auVar34 = vpunpcklwd_avx2(auVar45,auVar37);
  auVar35 = vpunpckhwd_avx2(auVar45,auVar37);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x228);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x198);
  uVar21 = uVar1 << 0x10 | uVar20 & 0xffff;
  auVar42._4_4_ = uVar21;
  auVar42._0_4_ = uVar21;
  auVar42._8_4_ = uVar21;
  auVar42._12_4_ = uVar21;
  auVar42._16_4_ = uVar21;
  auVar42._20_4_ = uVar21;
  auVar42._24_4_ = uVar21;
  auVar42._28_4_ = uVar21;
  iVar18 = (uVar1 & 0xffff) + uVar20 * -0x10000;
  auVar45._4_4_ = iVar18;
  auVar45._0_4_ = iVar18;
  auVar45._8_4_ = iVar18;
  auVar45._12_4_ = iVar18;
  auVar45._16_4_ = iVar18;
  auVar45._20_4_ = iVar18;
  auVar45._24_4_ = iVar18;
  auVar45._28_4_ = iVar18;
  auVar32 = vpmaddwd_avx2(auVar34,auVar42);
  auVar33 = vpmaddwd_avx2(auVar35,auVar42);
  auVar34 = vpmaddwd_avx2(auVar34,auVar45);
  auVar35 = vpmaddwd_avx2(auVar35,auVar45);
  auVar32 = vpaddd_avx2(auVar32,auVar23);
  auVar40 = vpsrad_avx2(auVar32,auVar22);
  auVar32 = vpaddd_avx2(auVar33,auVar23);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  alVar10 = (__m256i)vpackssdw_avx2(auVar40,auVar32);
  auVar32 = vpaddd_avx2(auVar34,auVar23);
  auVar33 = vpaddd_avx2(auVar35,auVar23);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar33 = vpsrad_avx2(auVar33,auVar22);
  alVar11 = (__m256i)vpackssdw_avx2(auVar32,auVar33);
  auVar34 = vpunpcklwd_avx2(auVar25,auVar46);
  auVar35 = vpunpckhwd_avx2(auVar25,auVar46);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x178);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar16 + 0x248);
  uVar21 = uVar20 << 0x10 | uVar1 & 0xffff;
  auVar46._4_4_ = uVar21;
  auVar46._0_4_ = uVar21;
  auVar46._8_4_ = uVar21;
  auVar46._12_4_ = uVar21;
  auVar46._16_4_ = uVar21;
  auVar46._20_4_ = uVar21;
  auVar46._24_4_ = uVar21;
  auVar46._28_4_ = uVar21;
  iVar18 = (uVar20 & 0xffff) + uVar1 * -0x10000;
  auVar37._4_4_ = iVar18;
  auVar37._0_4_ = iVar18;
  auVar37._8_4_ = iVar18;
  auVar37._12_4_ = iVar18;
  auVar37._16_4_ = iVar18;
  auVar37._20_4_ = iVar18;
  auVar37._24_4_ = iVar18;
  auVar37._28_4_ = iVar18;
  auVar32 = vpmaddwd_avx2(auVar46,auVar34);
  auVar33 = vpmaddwd_avx2(auVar46,auVar35);
  auVar34 = vpmaddwd_avx2(auVar37,auVar34);
  auVar35 = vpmaddwd_avx2(auVar37,auVar35);
  auVar32 = vpaddd_avx2(auVar32,auVar23);
  auVar33 = vpaddd_avx2(auVar33,auVar23);
  auVar34 = vpaddd_avx2(auVar34,auVar23);
  auVar35 = vpaddd_avx2(auVar35,auVar23);
  auVar32 = vpsrad_avx2(auVar32,auVar22);
  auVar33 = vpsrad_avx2(auVar33,auVar22);
  auVar34 = vpsrad_avx2(auVar34,auVar22);
  alVar12 = (__m256i)vpackssdw_avx2(auVar32,auVar33);
  auVar32 = vpsrad_avx2(auVar35,auVar22);
  alVar13 = (__m256i)vpackssdw_avx2(auVar34,auVar32);
  local_158 = auVar30._0_8_;
  lStack_150 = auVar30._8_8_;
  lStack_148 = auVar30._16_8_;
  lStack_140 = auVar30._24_8_;
  (*output)[0] = local_158;
  (*output)[1] = lStack_150;
  (*output)[2] = lStack_148;
  (*output)[3] = lStack_140;
  output[1] = alVar12;
  local_b8 = auVar31._0_8_;
  lStack_b0 = auVar31._8_8_;
  lStack_a8 = auVar31._16_8_;
  lStack_a0 = auVar31._24_8_;
  output[2][0] = local_b8;
  output[2][1] = lStack_b0;
  output[2][2] = lStack_a8;
  output[2][3] = lStack_a0;
  output[3] = alVar10;
  output[4] = alVar3;
  output[5] = alVar8;
  output[6] = alVar5;
  output[7] = alVar6;
  output[8] = alVar7;
  output[9] = alVar4;
  output[10] = alVar9;
  local_d8 = auVar47._0_8_;
  lStack_d0 = auVar47._8_8_;
  lStack_c8 = auVar47._16_8_;
  lStack_c0 = auVar47._24_8_;
  output[0xb][0] = local_d8;
  output[0xb][1] = lStack_d0;
  output[0xb][2] = lStack_c8;
  output[0xb][3] = lStack_c0;
  output[0xc] = alVar11;
  local_58 = auVar15._0_8_;
  lStack_50 = auVar15._8_8_;
  lStack_48 = auVar15._16_8_;
  lStack_40 = auVar15._24_8_;
  output[0xd][0] = local_58;
  output[0xd][1] = lStack_50;
  output[0xd][2] = lStack_48;
  output[0xd][3] = lStack_40;
  output[0xe] = alVar13;
  local_118 = auVar14._0_8_;
  lStack_110 = auVar14._8_8_;
  lStack_108 = auVar14._16_8_;
  lStack_100 = auVar14._24_8_;
  output[0xf][0] = local_118;
  output[0xf][1] = lStack_110;
  output[0xf][2] = lStack_108;
  output[0xf][3] = lStack_100;
  return;
}

Assistant:

static inline void fadst16x16_new_avx2(const __m256i *input, __m256i *output,
                                       int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __zero = _mm256_setzero_si256();
  const __m256i _r = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);
  __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);
  __m256i cospi_m48_p16 = pair_set_w16_epi16(-cospi[48], cospi[16]);
  __m256i cospi_p08_p56 = pair_set_w16_epi16(cospi[8], cospi[56]);
  __m256i cospi_p56_m08 = pair_set_w16_epi16(cospi[56], -cospi[8]);
  __m256i cospi_p40_p24 = pair_set_w16_epi16(cospi[40], cospi[24]);
  __m256i cospi_p24_m40 = pair_set_w16_epi16(cospi[24], -cospi[40]);
  __m256i cospi_m56_p08 = pair_set_w16_epi16(-cospi[56], cospi[8]);
  __m256i cospi_m24_p40 = pair_set_w16_epi16(-cospi[24], cospi[40]);
  __m256i cospi_p02_p62 = pair_set_w16_epi16(cospi[2], cospi[62]);
  __m256i cospi_p62_m02 = pair_set_w16_epi16(cospi[62], -cospi[2]);
  __m256i cospi_p10_p54 = pair_set_w16_epi16(cospi[10], cospi[54]);
  __m256i cospi_p54_m10 = pair_set_w16_epi16(cospi[54], -cospi[10]);
  __m256i cospi_p18_p46 = pair_set_w16_epi16(cospi[18], cospi[46]);
  __m256i cospi_p46_m18 = pair_set_w16_epi16(cospi[46], -cospi[18]);
  __m256i cospi_p26_p38 = pair_set_w16_epi16(cospi[26], cospi[38]);
  __m256i cospi_p38_m26 = pair_set_w16_epi16(cospi[38], -cospi[26]);
  __m256i cospi_p34_p30 = pair_set_w16_epi16(cospi[34], cospi[30]);
  __m256i cospi_p30_m34 = pair_set_w16_epi16(cospi[30], -cospi[34]);
  __m256i cospi_p42_p22 = pair_set_w16_epi16(cospi[42], cospi[22]);
  __m256i cospi_p22_m42 = pair_set_w16_epi16(cospi[22], -cospi[42]);
  __m256i cospi_p50_p14 = pair_set_w16_epi16(cospi[50], cospi[14]);
  __m256i cospi_p14_m50 = pair_set_w16_epi16(cospi[14], -cospi[50]);
  __m256i cospi_p58_p06 = pair_set_w16_epi16(cospi[58], cospi[6]);
  __m256i cospi_p06_m58 = pair_set_w16_epi16(cospi[6], -cospi[58]);

  // stage 1
  __m256i x1[16];
  x1[0] = input[0];
  x1[1] = _mm256_subs_epi16(__zero, input[15]);
  x1[2] = _mm256_subs_epi16(__zero, input[7]);
  x1[3] = input[8];
  x1[4] = _mm256_subs_epi16(__zero, input[3]);
  x1[5] = input[12];
  x1[6] = input[4];
  x1[7] = _mm256_subs_epi16(__zero, input[11]);
  x1[8] = _mm256_subs_epi16(__zero, input[1]);
  x1[9] = input[14];
  x1[10] = input[6];
  x1[11] = _mm256_subs_epi16(__zero, input[9]);
  x1[12] = input[2];
  x1[13] = _mm256_subs_epi16(__zero, input[13]);
  x1[14] = _mm256_subs_epi16(__zero, input[5]);
  x1[15] = input[10];

  // stage 2
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[2], &x1[3], _r, cos_bit);
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[6], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[10], &x1[11], _r, cos_bit);
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[14], &x1[15], _r, cos_bit);

  // stage 3
  btf_16_adds_subs_avx2(&x1[0], &x1[2]);
  btf_16_adds_subs_avx2(&x1[1], &x1[3]);
  btf_16_adds_subs_avx2(&x1[4], &x1[6]);
  btf_16_adds_subs_avx2(&x1[5], &x1[7]);
  btf_16_adds_subs_avx2(&x1[8], &x1[10]);
  btf_16_adds_subs_avx2(&x1[9], &x1[11]);
  btf_16_adds_subs_avx2(&x1[12], &x1[14]);
  btf_16_adds_subs_avx2(&x1[13], &x1[15]);

  // stage 4
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x1[4], &x1[5], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_p16, cospi_p16_p48, &x1[6], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x1[12], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_p16, cospi_p16_p48, &x1[14], &x1[15], _r, cos_bit);

  // stage 5
  btf_16_adds_subs_avx2(&x1[0], &x1[4]);
  btf_16_adds_subs_avx2(&x1[1], &x1[5]);
  btf_16_adds_subs_avx2(&x1[2], &x1[6]);
  btf_16_adds_subs_avx2(&x1[3], &x1[7]);
  btf_16_adds_subs_avx2(&x1[8], &x1[12]);
  btf_16_adds_subs_avx2(&x1[9], &x1[13]);
  btf_16_adds_subs_avx2(&x1[10], &x1[14]);
  btf_16_adds_subs_avx2(&x1[11], &x1[15]);

  // stage 6
  btf_16_w16_avx2(cospi_p08_p56, cospi_p56_m08, &x1[8], &x1[9], _r, cos_bit);
  btf_16_w16_avx2(cospi_p40_p24, cospi_p24_m40, &x1[10], &x1[11], _r, cos_bit);
  btf_16_w16_avx2(cospi_m56_p08, cospi_p08_p56, &x1[12], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m24_p40, cospi_p40_p24, &x1[14], &x1[15], _r, cos_bit);

  // stage 7
  btf_16_adds_subs_avx2(&x1[0], &x1[8]);
  btf_16_adds_subs_avx2(&x1[1], &x1[9]);
  btf_16_adds_subs_avx2(&x1[2], &x1[10]);
  btf_16_adds_subs_avx2(&x1[3], &x1[11]);
  btf_16_adds_subs_avx2(&x1[4], &x1[12]);
  btf_16_adds_subs_avx2(&x1[5], &x1[13]);
  btf_16_adds_subs_avx2(&x1[6], &x1[14]);
  btf_16_adds_subs_avx2(&x1[7], &x1[15]);

  // stage 8
  btf_16_w16_avx2(cospi_p02_p62, cospi_p62_m02, &x1[0], &x1[1], _r, cos_bit);
  btf_16_w16_avx2(cospi_p10_p54, cospi_p54_m10, &x1[2], &x1[3], _r, cos_bit);
  btf_16_w16_avx2(cospi_p18_p46, cospi_p46_m18, &x1[4], &x1[5], _r, cos_bit);
  btf_16_w16_avx2(cospi_p26_p38, cospi_p38_m26, &x1[6], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p34_p30, cospi_p30_m34, &x1[8], &x1[9], _r, cos_bit);
  btf_16_w16_avx2(cospi_p42_p22, cospi_p22_m42, &x1[10], &x1[11], _r, cos_bit);
  btf_16_w16_avx2(cospi_p50_p14, cospi_p14_m50, &x1[12], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_p58_p06, cospi_p06_m58, &x1[14], &x1[15], _r, cos_bit);

  // stage 9
  output[0] = x1[1];
  output[1] = x1[14];
  output[2] = x1[3];
  output[3] = x1[12];
  output[4] = x1[5];
  output[5] = x1[10];
  output[6] = x1[7];
  output[7] = x1[8];
  output[8] = x1[9];
  output[9] = x1[6];
  output[10] = x1[11];
  output[11] = x1[4];
  output[12] = x1[13];
  output[13] = x1[2];
  output[14] = x1[15];
  output[15] = x1[0];
}